

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ExternalCommand::start
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti)

{
  pointer ppBVar1;
  StringRef str;
  pointer ppBVar2;
  void *pvVar3;
  uintptr_t inputID;
  void *pvVar4;
  TaskInterface local_e8;
  BuildSystem *local_d8;
  ExternalCommand *local_d0;
  BuildKey local_c8;
  undefined1 local_a8 [112];
  bool local_38;
  
  local_38 = false;
  local_e8.impl = ti.impl;
  local_e8.ctx = ti.ctx;
  llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
            (&(this->skipValue).Storage,
             (OptionalStorage<llbuild::buildsystem::BuildValue,_false> *)local_a8);
  if (local_38 == true) {
    BuildValue::~BuildValue((BuildValue *)local_a8);
  }
  llvm::SmallVectorImpl<llbuild::buildsystem::BuildKey>::clear
            (&(this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>);
  ppBVar2 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = ti.impl;
  pvVar4 = ti.ctx;
  local_d0 = this;
  if (ppBVar2 != ppBVar1) {
    inputID = 0;
    local_d8 = system;
    do {
      str.Data = ((*ppBVar2)->super_Node).name._M_dataplus._M_p;
      str.Length = ((*ppBVar2)->super_Node).name._M_string_length;
      BuildKey::BuildKey(&local_c8,'N',str);
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_c8.key.key._M_dataplus._M_p,
                 local_c8.key.key._M_dataplus._M_p + local_c8.key.key._M_string_length);
      core::TaskInterface::request(&local_e8,(KeyType *)local_a8,inputID);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.key.key._M_dataplus._M_p != &local_c8.key.key.field_2) {
        operator_delete(local_c8.key.key._M_dataplus._M_p,
                        local_c8.key.key.field_2._M_allocated_capacity + 1);
      }
      ppBVar2 = ppBVar2 + 1;
      inputID = (uintptr_t)((int)inputID + 1);
      pvVar3 = local_e8.impl;
      system = local_d8;
      pvVar4 = local_e8.ctx;
    } while (ppBVar2 != ppBVar1);
  }
  (*(local_d0->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x18])
            (local_d0,system,pvVar3,pvVar4);
  return;
}

Assistant:

void ExternalCommand::start(BuildSystem& system,
                            core::TaskInterface ti) {
  // Initialize the build state.
  skipValue = llvm::None;
  missingInputKeys.clear();

  // Request all of the inputs.
  unsigned id = 0;
  for (auto it = inputs.begin(), ie = inputs.end(); it != ie; ++it, ++id) {
    ti.request(BuildKey::makeNode(*it).toData(), id);
  }

  // Delegate to the subclass in case it needs more custom inputs.
  startExternalCommand(system, ti);
}